

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O1

ItemFlags __thiscall QStandardItem::flags(QStandardItem *this)

{
  QFlagsStorage<Qt::ItemFlag> QVar1;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_4_ = 0xaaaaaaaa;
  local_38._20_4_ = 0xaaaaaaaa;
  uStack_20 = 0xaaaaaaaa;
  uStack_1c = 0xaaaaaaaa;
  local_38._0_4_ = 0xaaaaaaaa;
  local_38._4_4_ = 0xaaaaaaaa;
  local_38._8_4_ = 0xaaaaaaaa;
  local_38._12_4_ = 0xaaaaaaaa;
  (*this->_vptr_QStandardItem[2])(&local_38,this,0xff);
  QVar1.i = 0x2f;
  if (3 < CONCAT44(uStack_1c,uStack_20)) {
    QVar1.i = ::QVariant::toInt((bool *)local_38.data);
  }
  ::QVariant::~QVariant((QVariant *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)QVar1.i;
  }
  __stack_chk_fail();
}

Assistant:

Qt::ItemFlags QStandardItem::flags() const
{
    QVariant v = data(DataFlagsRole);
    if (!v.isValid())
        return (Qt::ItemIsSelectable|Qt::ItemIsEnabled|Qt::ItemIsEditable
                |Qt::ItemIsDragEnabled|Qt::ItemIsDropEnabled);
    return Qt::ItemFlags(v.toInt());
}